

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToBuffer::prepare
          (BufferCopyToBuffer *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)8>_> *this_00;
  Context *pCVar1;
  DeviceInterface *vkd;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  VkDeviceSize size;
  VkMemoryPropertyFlags properties;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_98;
  deUint64 local_78;
  DeviceInterface *pDStack_70;
  VkDevice local_68;
  VkAllocationCallbacks *pVStack_60;
  InstanceInterface *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pCVar1 = context->m_context;
  local_50 = pCVar1->m_vki;
  vkd = pCVar1->m_vkd;
  physicalDevice = pCVar1->m_physicalDevice;
  device = pCVar1->m_device;
  this_01 = &local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,&pCVar1->m_queueFamilies
            );
  size = context->m_currentBufferSize;
  this->m_bufferSize = size;
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_98,vkd,device,size,2,
               VK_SHARING_MODE_EXCLUSIVE,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  properties = (VkMemoryPropertyFlags)this_01;
  local_68 = local_98.m_data.deleter.m_device;
  pVStack_60 = local_98.m_data.deleter.m_allocator;
  local_78 = local_98.m_data.object.m_internal;
  pDStack_70 = local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_dstBuffer;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_68;
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVStack_60;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal = local_78;
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       pDStack_70;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_98);
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&local_98,local_50,vkd,physicalDevice,
                   device,(VkBuffer)
                          (this_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                          m_internal,properties);
  local_68 = local_98.m_data.deleter.m_device;
  pVStack_60 = local_98.m_data.deleter.m_allocator;
  local_78 = local_98.m_data.object.m_internal;
  pDStack_70 = local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::reset
            (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = local_68;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       pVStack_60;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = local_78
  ;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       pDStack_70;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&local_98);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void BufferCopyToBuffer::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_bufferSize = context.getBufferSize();

	m_dstBuffer	= createBuffer(vkd, device, m_bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies);
	m_memory	= bindBufferMemory(vki, vkd, physicalDevice, device, *m_dstBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT);
}